

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void test_comparison_operators(void)

{
  json d3;
  json d2;
  json d1;
  json i3;
  json i2;
  json i1;
  json s3;
  json s2;
  json s1;
  json local_320;
  json local_2c8;
  json local_270;
  json local_218;
  json local_1c0;
  json local_168;
  json local_110;
  json local_b8;
  json local_60;
  
  argo::json::json(&local_168,1);
  argo::json::json(&local_1c0,1);
  argo::json::json(&local_218,2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"testing int comparisons\n",0x18);
  test_comparison_operators_same(&local_168,&local_1c0,&local_218);
  argo::json::json(&local_270,1.0);
  argo::json::json(&local_2c8,1.0);
  argo::json::json(&local_320,2.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"testing double comparisons\n",0x1b);
  test_comparison_operators_same(&local_270,&local_2c8,&local_320);
  argo::json::json(&local_60,"a");
  argo::json::json(&local_b8,"a");
  argo::json::json(&local_110,"b");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"testing string comparisons\n",0x1b);
  test_comparison_operators_same(&local_270,&local_2c8,&local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"testing int/double comparisons\n",0x1f);
  test_comparison_operators_same(&local_168,&local_1c0,&local_218);
  test_comparison_operators_same(&local_168,&local_1c0,&local_320);
  test_comparison_operators_same(&local_168,&local_2c8,&local_218);
  test_comparison_operators_same(&local_168,&local_2c8,&local_320);
  test_comparison_operators_same(&local_270,&local_1c0,&local_218);
  test_comparison_operators_same(&local_270,&local_1c0,&local_320);
  test_comparison_operators_same(&local_270,&local_2c8,&local_218);
  test_comparison_operators_same(&local_270,&local_2c8,&local_320);
  argo::json::~json(&local_110);
  argo::json::~json(&local_b8);
  argo::json::~json(&local_60);
  argo::json::~json(&local_320);
  argo::json::~json(&local_2c8);
  argo::json::~json(&local_270);
  argo::json::~json(&local_218);
  argo::json::~json(&local_1c0);
  argo::json::~json(&local_168);
  return;
}

Assistant:

void test_comparison_operators()
{
    // test < > <= >= == != where both sides are the same type

    json i1(1);
    json i2(1);
    json i3(2);
    jlog << "testing int comparisons\n";
    test_comparison_operators_same(i1, i2, i3);
    json d1(1.0);
    json d2(1.0);
    json d3(2.0);
    jlog << "testing double comparisons\n";
    test_comparison_operators_same(d1, d2, d3);
    json s1("a");
    json s2("a");
    json s3("b");
    jlog << "testing string comparisons\n";
    test_comparison_operators_same(d1, d2, d3);

    // test < > <= >= == != where one side is an int and the other is a double
    jlog << "testing int/double comparisons\n";
    test_comparison_operators_same(i1, i2, i3);
    test_comparison_operators_same(i1, i2, d3);
    test_comparison_operators_same(i1, d2, i3);
    test_comparison_operators_same(i1, d2, d3);
    test_comparison_operators_same(d1, i2, i3);
    test_comparison_operators_same(d1, i2, d3);
    test_comparison_operators_same(d1, d2, i3);
    test_comparison_operators_same(d1, d2, d3);
}